

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int patternCompare(u8 *zPattern,u8 *zString,int esc,int noCase)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_44;
  int prior_c;
  int prevEscape;
  u8 matchSet;
  u8 matchAll;
  uint uStack_34;
  u8 matchOne;
  int seen;
  int invert;
  int c2;
  int c;
  int noCase_local;
  int esc_local;
  u8 *zString_local;
  u8 *zPattern_local;
  
  bVar1 = false;
  if ((zPattern == (u8 *)0x0) ||
     (_noCase_local = zString, zString_local = zPattern, zString == (u8 *)0x0)) {
    return 0;
  }
  while( true ) {
    while( true ) {
      while( true ) {
        invert = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
        if (invert == 0) {
          return (uint)(*_noCase_local == '\0');
        }
        if ((!bVar1) && (invert == 0x2a)) {
          do {
            invert = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
            if (invert != 0x2a && invert != 0x3f) {
              if (invert == 0) {
                return 1;
              }
              if (invert == esc) {
                invert = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
                if (invert == 0) {
                  return 0;
                }
              }
              else if (invert == 0x5b) {
                return 0;
              }
              while( true ) {
                seen = jx9Utf8Read(_noCase_local,(uchar *)0x0,(uchar **)&noCase_local);
                if (seen == 0) {
                  return 0;
                }
                if (noCase == 0) {
                  while (seen != 0 && seen != invert) {
                    seen = jx9Utf8Read(_noCase_local,(uchar *)0x0,(uchar **)&noCase_local);
                  }
                }
                else {
                  if (seen < 0x80) {
                    seen = (int)""[seen];
                  }
                  if (invert < 0x80) {
                    invert = (int)""[invert];
                  }
                  while (seen != 0 && seen != invert) {
                    seen = jx9Utf8Read(_noCase_local,(uchar *)0x0,(uchar **)&noCase_local);
                    if (seen < 0x80) {
                      seen = (int)""[seen];
                    }
                  }
                }
                if (seen == 0) break;
                iVar2 = patternCompare(zString_local,_noCase_local,esc,noCase);
                if (iVar2 != 0) {
                  return 1;
                }
              }
              return 0;
            }
          } while ((invert != 0x3f) ||
                  (iVar2 = jx9Utf8Read(_noCase_local,(uchar *)0x0,(uchar **)&noCase_local),
                  iVar2 != 0));
          return 0;
        }
        if ((bVar1) || (invert != 0x3f)) break;
        iVar2 = jx9Utf8Read(_noCase_local,(uchar *)0x0,(uchar **)&noCase_local);
        if (iVar2 == 0) {
          return 0;
        }
      }
      if (invert == 0x5b) break;
      if ((esc != invert) || (bVar1)) {
        seen = jx9Utf8Read(_noCase_local,(uchar *)0x0,(uchar **)&noCase_local);
        if (noCase != 0) {
          if (invert < 0x80) {
            invert = (int)""[invert];
          }
          if (seen < 0x80) {
            seen = (int)""[seen];
          }
        }
        if (invert != seen) {
          return 0;
        }
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
    }
    local_44 = 0;
    if (esc == 0) {
      return 0;
    }
    prevEscape = 0;
    iVar2 = jx9Utf8Read(_noCase_local,(uchar *)0x0,(uchar **)&noCase_local);
    if (iVar2 == 0) break;
    seen = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
    bVar4 = seen == 0x5e;
    if (bVar4) {
      seen = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
    }
    uStack_34 = (uint)bVar4;
    if (seen == 0x5d) {
      prevEscape = (int)(iVar2 == 0x5d);
      seen = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
    }
    while (seen != 0 && seen != 0x5d) {
      if ((((seen == 0x2d) && (*zString_local != ']')) && (*zString_local != '\0')) &&
         (0 < local_44)) {
        iVar3 = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
        if ((local_44 <= iVar2) && (iVar2 <= iVar3)) {
          prevEscape = 1;
        }
        local_44 = 0;
      }
      else {
        if (iVar2 == seen) {
          prevEscape = 1;
        }
        local_44 = seen;
      }
      seen = jx9Utf8Read(zString_local,(uchar *)0x0,&zString_local);
    }
    if ((seen == 0) || (prevEscape == uStack_34)) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const int esc,                    /* The escape character */
  int noCase
){
  int c, c2;
  int invert;
  int seen;
  u8 matchOne = '?';
  u8 matchAll = '*';
  u8 matchSet = '[';
  int prevEscape = 0;     /* True if the previous character was 'escape' */

  if( !zPattern || !zString ) return 0;
  while( (c = jx9Utf8Read(zPattern, 0, &zPattern))!=0 ){
    if( !prevEscape && c==matchAll ){
      while( (c= jx9Utf8Read(zPattern, 0, &zPattern)) == matchAll
               || c == matchOne ){
        if( c==matchOne && jx9Utf8Read(zString, 0, &zString)==0 ){
          return 0;
        }
      }
      if( c==0 ){
        return 1;
      }else if( c==esc ){
        c = jx9Utf8Read(zPattern, 0, &zPattern);
        if( c==0 ){
          return 0;
        }
      }else if( c==matchSet ){
	  if( (esc==0) || (matchSet<0x80) ) return 0;
	  while( *zString && patternCompare(&zPattern[-1], zString, esc, noCase)==0 ){
          SQLITE_SKIP_UTF8(zString);
        }
        return *zString!=0;
      }
      while( (c2 = jx9Utf8Read(zString, 0, &zString))!=0 ){
        if( noCase ){
          GlogUpperToLower(c2);
          GlogUpperToLower(c);
          while( c2 != 0 && c2 != c ){
            c2 = jx9Utf8Read(zString, 0, &zString);
            GlogUpperToLower(c2);
          }
        }else{
          while( c2 != 0 && c2 != c ){
            c2 = jx9Utf8Read(zString, 0, &zString);
          }
        }
        if( c2==0 ) return 0;
		if( patternCompare(zPattern, zString, esc, noCase) ) return 1;
      }
      return 0;
    }else if( !prevEscape && c==matchOne ){
      if( jx9Utf8Read(zString, 0, &zString)==0 ){
        return 0;
      }
    }else if( c==matchSet ){
      int prior_c = 0;
      if( esc == 0 ) return 0;
      seen = 0;
      invert = 0;
      c = jx9Utf8Read(zString, 0, &zString);
      if( c==0 ) return 0;
      c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      if( c2=='^' ){
        invert = 1;
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      if( c2==']' ){
        if( c==']' ) seen = 1;
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      while( c2 && c2!=']' ){
        if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
          c2 = jx9Utf8Read(zPattern, 0, &zPattern);
          if( c>=prior_c && c<=c2 ) seen = 1;
          prior_c = 0;
        }else{
          if( c==c2 ){
            seen = 1;
          }
          prior_c = c2;
        }
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      if( c2==0 || (seen ^ invert)==0 ){
        return 0;
      }
    }else if( esc==c && !prevEscape ){
      prevEscape = 1;
    }else{
      c2 = jx9Utf8Read(zString, 0, &zString);
      if( noCase ){
        GlogUpperToLower(c);
        GlogUpperToLower(c2);
      }
      if( c!=c2 ){
        return 0;
      }
      prevEscape = 0;
    }
  }
  return *zString==0;
}